

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O0

avl_node * avl_prev(avl_node *node)

{
  avl_node *paVar1;
  avl_node *p;
  avl_node *node_local;
  avl_node *local_8;
  
  if (node == (avl_node *)0x0) {
    local_8 = (avl_node *)0x0;
  }
  else {
    p = node;
    if (node->left == (avl_node *)0x0) {
      if (((ulong)node->parent & 0xfffffffffffffffc) != 0) {
        paVar1 = node->parent;
        while (node_local = (avl_node *)((ulong)paVar1 & 0xfffffffffffffffc),
              node_local != (avl_node *)0x0) {
          if (node_local->right == p) {
            return node_local;
          }
          p = node_local;
          paVar1 = node_local->parent;
        }
      }
      local_8 = (avl_node *)0x0;
    }
    else {
      for (node_local = node->left; node_local != (avl_node *)0x0; node_local = node_local->right) {
        p = node_local;
      }
      local_8 = p;
    }
  }
  return local_8;
}

Assistant:

struct avl_node* avl_prev(struct avl_node *node)
{
    if (node == NULL) return NULL;

#ifdef _AVL_NEXT_POINTER
    return node->prev;
#else

    struct avl_node *p;

    // largest value of left subtree
    if (node->left) {
        p = node;
        node = node->left;
        while (node) {
            p = node;
            node = node->right;
        }
        return p;
    }

    // node does not have left child
    if (avl_parent(node)) {
        // find first parent that has left child
        p = node;
        node = avl_parent(node);
        while(node) {
            if (node->right == p) {
                return node;
            }
            p = node;
            node = avl_parent(node);
        }
    }
#endif
    return NULL;
}